

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvrm_decode_ioctl.c
# Opt level: O3

void decode_nvrm_ioctl_card_info2(nvrm_ioctl_card_info2 *s)

{
  anon_struct_72_18_6cfec3b8 *paVar1;
  bool bVar2;
  long lVar3;
  anon_struct_72_18_6cfec3b8 *paVar4;
  ulong uVar5;
  
  uVar5 = 0;
  bVar2 = false;
  paVar4 = s->card;
  do {
    paVar1 = s->card + uVar5;
    lVar3 = -0x48;
    do {
      if (*(char *)((long)&paVar4[1].flags + lVar3) != '\0') {
        if ((!bVar2) && (fputc(10,_stdout), mmt_sync_fd != -1)) {
          fflush(_stdout);
        }
        if (indent_logs == 0) {
          fprintf(_stdout,"LOG:     %d: ",uVar5 & 0xffffffff);
        }
        else {
          fprintf(_stdout,"%64s    %d: "," ",uVar5 & 0xffffffff);
        }
        nvrm_pfx = "";
        fprintf(_stdout,"%sflags: 0x%08x","",(ulong)paVar1->flags);
        nvrm_pfx = nvrm_sep;
        fprintf(_stdout,"%sdomain: 0x%08x",nvrm_sep,(ulong)paVar1->domain);
        nvrm_pfx = nvrm_sep;
        fprintf(_stdout,"%sbus: %3d",nvrm_sep,(ulong)paVar1->bus);
        nvrm_pfx = nvrm_sep;
        fprintf(_stdout,"%sslot: %3d",nvrm_sep,(ulong)paVar1->slot);
        nvrm_pfx = nvrm_sep;
        fprintf(_stdout,"%sfunction: %3d",nvrm_sep,(ulong)paVar1->function);
        nvrm_pfx = nvrm_sep;
        if (paVar1->_pad0 != 0) {
          fprintf(_stdout,"%s%s_pad0: 0x%02x%s",nvrm_sep,colors->err,(ulong)paVar1->_pad0,
                  colors->reset);
        }
        nvrm_pfx = nvrm_sep;
        fprintf(_stdout,"%svendor_id: 0x%04x",nvrm_sep,(ulong)paVar1->vendor_id);
        nvrm_pfx = nvrm_sep;
        fprintf(_stdout,"%sdevice_id: 0x%04x",nvrm_sep,(ulong)paVar1->device_id);
        nvrm_pfx = nvrm_sep;
        if (paVar1->_pad1 != 0) {
          fprintf(_stdout,"%s%s_pad1: 0x%08x%s",nvrm_sep,colors->err,(ulong)paVar1->_pad1,
                  colors->reset);
        }
        nvrm_pfx = nvrm_sep;
        fprintf(_stdout,"%sgpu_id: 0x%08x",nvrm_sep,(ulong)paVar1->gpu_id);
        nvrm_pfx = nvrm_sep;
        fprintf(_stdout,"%sinterrupt: 0x%08x",nvrm_sep,(ulong)paVar1->interrupt);
        nvrm_pfx = nvrm_sep;
        if (paVar1->_pad2 != 0) {
          fprintf(_stdout,"%s%s_pad2: 0x%08x%s",nvrm_sep,colors->err,(ulong)paVar1->_pad2,
                  colors->reset);
        }
        nvrm_pfx = nvrm_sep;
        fprintf(_stdout,"%sreg_address: 0x%016lx",nvrm_sep,paVar1->reg_address);
        nvrm_pfx = nvrm_sep;
        fprintf(_stdout,"%sreg_size: 0x%016lx",nvrm_sep,paVar1->reg_size);
        nvrm_pfx = nvrm_sep;
        fprintf(_stdout,"%sfb_address: 0x%016lx",nvrm_sep,paVar1->fb_address);
        nvrm_pfx = nvrm_sep;
        fprintf(_stdout,"%sfb_size: 0x%016lx",nvrm_sep,paVar1->fb_size);
        nvrm_pfx = nvrm_sep;
        fprintf(_stdout,"%sindex: %d",nvrm_sep,(ulong)paVar1->index);
        nvrm_pfx = nvrm_sep;
        if (paVar1->_pad3 != 0) {
          fprintf(_stdout,"%s%s_pad3: 0x%08x%s",nvrm_sep,colors->err,(ulong)paVar1->_pad3,
                  colors->reset);
        }
        nvrm_pfx = nvrm_sep;
        fputc(10,_stdout);
        bVar2 = true;
        if (mmt_sync_fd != -1) {
          fflush(_stdout);
        }
        break;
      }
      lVar3 = lVar3 + 1;
    } while (lVar3 != 0);
    uVar5 = uVar5 + 1;
    paVar4 = paVar4 + 1;
    if (uVar5 == 0x20) {
      return;
    }
  } while( true );
}

Assistant:

static void decode_nvrm_ioctl_card_info2(struct nvrm_ioctl_card_info2 *s)
{
	int nl = 0;
	int i, j;
	for (i = 0; i < 32; ++i)
	{
		int valid = 0;
		for (j = 0; j < sizeof(s->card[i]); ++j)
			if (((unsigned char *)&s->card[i])[j] != 0)
			{
				valid = 1;
				break;
			}
		if (valid)
		{
			if (!nl)
			{
				mmt_log_cont_nl();
				nl = 1;
			}

			mmt_log("    %d: ", i);
			nvrm_reset_pfx();
			nvrm_print_x32(&s->card[i], flags);
			nvrm_print_x32(&s->card[i], domain);
			nvrm_print_d32_align(&s->card[i], bus, 3);
			nvrm_print_d32_align(&s->card[i], slot, 3);
			nvrm_print_d32_align(&s->card[i], function, 3);
			nvrm_print_pad_x8(&s->card[i], _pad0);
			nvrm_print_x16(&s->card[i], vendor_id);
			nvrm_print_x16(&s->card[i], device_id);
			nvrm_print_pad_x32(&s->card[i], _pad1);
			nvrm_print_x32(&s->card[i], gpu_id);
			nvrm_print_x32(&s->card[i], interrupt);
			nvrm_print_pad_x32(&s->card[i], _pad2);
			nvrm_print_x64(&s->card[i], reg_address);
			nvrm_print_x64(&s->card[i], reg_size);
			nvrm_print_x64(&s->card[i], fb_address);
			nvrm_print_x64(&s->card[i], fb_size);
			nvrm_print_d32(&s->card[i], index);
			nvrm_print_pad_x32(&s->card[i], _pad3);
			mmt_log_cont_nl();
		}
	}
}